

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.hpp
# Opt level: O2

PointType __thiscall Bezier<3,_2>::at(Bezier<3,_2> *this,double *t,int *derivative_order)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  ulong uVar4;
  int *in_RCX;
  int *scalar;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  PointType PVar9;
  double t_;
  double *local_290;
  int *local_288;
  Bezier<3,_2> *local_280;
  ulong local_278;
  ulong local_270;
  long local_268;
  double local_260;
  undefined1 local_258 [40];
  XprTypeNested local_230;
  variable_if_dynamic<long,__1> vStack_228;
  variable_if_dynamic<long,__1> local_220;
  Index IStack_218;
  PointsType temp;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>
  local_1c0;
  undefined1 local_170 [48];
  variable_if_dynamic<long,__1> local_140;
  variable_if_dynamic<long,__1> vStack_138;
  variable_if_dynamic<long,__1> local_130;
  Index IStack_128;
  scalar_constant_op<double> local_108;
  PointerType local_100;
  undefined8 uStack_f8;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  variable_if_dynamic<long,__1> local_e0;
  Index IStack_d8;
  Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true> local_c0;
  StorageBaseType local_90 [48];
  StorageBaseType local_60 [48];
  
  dVar2 = *(double *)derivative_order;
  uVar7 = 0;
  uVar8 = 0x3ff00000;
  if (dVar2 <= 1.0) {
    uVar7 = SUB84(dVar2,0);
    uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  t_ = (double)(~-(ulong)(dVar2 < 0.0) & CONCAT44(uVar8,uVar7));
  lVar3 = (long)*in_RCX;
  if (lVar3 < 4) {
    temp.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data.array[0] =
         t[lVar3 * 8 + 2];
    temp.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data.array[1] =
         (t + lVar3 * 8 + 2)[1];
    pdVar1 = t + lVar3 * 8 + 4;
    uVar7 = *(undefined4 *)pdVar1;
    uVar8 = *(undefined4 *)((long)pdVar1 + 4);
    temp.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data.array[3].
    _0_4_ = *(undefined4 *)(pdVar1 + 1);
    temp.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data.array[3].
    _4_4_ = *(undefined4 *)((long)pdVar1 + 0xc);
    temp.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data.array[4] =
         t[lVar3 * 8 + 6];
    temp.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data.array[5] =
         (t + lVar3 * 8 + 6)[1];
    temp.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data.array[6] =
         t[lVar3 * 8 + 8];
    temp.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data.array[7] =
         (t + lVar3 * 8 + 8)[1];
    local_278 = (ulong)(3 - *in_RCX);
    uVar4 = 0;
    local_290 = t;
    local_288 = in_RCX;
    local_280 = this;
    temp.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data.array[2].
    _0_4_ = uVar7;
    temp.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data.array[2].
    _4_4_ = uVar8;
    while (uVar4 != local_278) {
      local_268 = local_278 - uVar4;
      lVar3 = 0;
      local_270 = uVar4;
      while (lVar3 < local_268) {
        local_260 = 1.0 - t_;
        Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>::Block
                  ((Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true> *)local_60,&temp,lVar3);
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>
                          *)local_258,&local_260,local_60);
        Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>::Block
                  ((Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true> *)local_90,&temp,
                   lVar3 + 1);
        Eigen::operator*(&local_1c0,&t_,local_90);
        local_170._24_8_ = local_258._16_8_;
        local_130.m_value = local_220.m_value;
        IStack_128 = IStack_218;
        local_140.m_value = (long)local_230;
        vStack_138.m_value = vStack_228.m_value;
        local_170._32_8_ = local_258._24_8_;
        local_170._40_8_ = local_258._32_8_;
        local_108.m_other = local_1c0.m_lhs.m_functor.m_other;
        local_e0.m_value =
             local_1c0.m_rhs.
             super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
             m_startCol.m_value;
        IStack_d8 = local_1c0.m_rhs.
                    super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
                    super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
                    m_outerStride;
        local_f0 = local_1c0.m_rhs.
                   super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
                   super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
                   m_xpr._0_4_;
        uStack_ec = local_1c0.m_rhs.
                    super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
                    super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
                    m_xpr._4_4_;
        uStack_e8 = (undefined4)
                    local_1c0.m_rhs.
                    super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
                    super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
                    m_startRow.m_value;
        uStack_e4 = local_1c0.m_rhs.
                    super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
                    super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
                    m_startRow.m_value._4_4_;
        local_100 = local_1c0.m_rhs.
                    super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
                    super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_0>
                    .m_data;
        uStack_f8 = local_1c0.m_rhs.
                    super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
                    super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_0>
                    ._8_8_;
        uVar7 = local_1c0.m_rhs.
                super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.m_xpr.
                _0_4_;
        uVar8 = local_1c0.m_rhs.
                super_BlockImpl<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>.m_xpr.
                _4_4_;
        Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>::Block(&local_c0,&temp,lVar3)
        ;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true>const>const>>
                  (&local_c0,
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>_>
                    *)local_170);
        lVar3 = lVar3 + 1;
      }
      uVar4 = local_270 + 1;
    }
    scalar = (int *)((long)local_290 + (long)*local_288 * 4 + 0x110);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true,_true> *)
                    local_258,&temp,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>
                      *)local_170,scalar,(StorageBaseType *)local_258);
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>const>const,Eigen::Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true>const>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_280,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>_>
                *)local_170);
    uVar5 = extraout_XMM0_Da_00;
    uVar6 = extraout_XMM0_Db_00;
  }
  else {
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)this,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)local_170);
    uVar5 = extraout_XMM0_Da;
    uVar6 = extraout_XMM0_Db;
  }
  PVar9.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]._4_4_
       = uVar6;
  PVar9.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]._0_4_
       = uVar5;
  PVar9.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]._4_4_
       = uVar8;
  PVar9.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]._0_4_
       = uVar7;
  return (PointType)
         PVar9.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
}

Assistant:

auto at(const double& t, const int& derivative_order = 0) const -> PointType override {
    double t_ = std::clamp(t, 0.0, 1.0);

    if (derivative_order > N) {
      return PointType::Zero();
    }

    /// De Casteljau’s Algorithm ///
    PointsType temp = derivative_precal_points_[derivative_order];

    int I_range = N - derivative_order;
    for (int i = 0; i < I_range; ++i) {
      int J_range = I_range - i;
      for (int j = 0; j < J_range; ++j) {
        {
          temp.col(j) = (1.0 - t_) * temp.col(j) + t_ * temp.col(j + 1);
        }
      }
    }
    return derivative_precal_prefix_[derivative_order] * temp.col(0);
  }